

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtxParam_setParameter(ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,uint value)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)value;
  switch(param) {
  case ZSTD_p_compressionLevel:
    if ((int)value < 0x17) {
      if (value == 0) {
        uVar2 = CCtxParams->compressionLevel;
        goto LAB_0017e4dc;
      }
    }
    else {
      uVar3 = 0x16;
    }
    uVar2 = (uint)uVar3;
    CCtxParams->disableLiteralCompression = (int)(uVar3 >> 0x1f);
    CCtxParams->compressionLevel = uVar2;
LAB_0017e4dc:
    sVar1 = 0;
    if (0 < (int)uVar2) {
      sVar1 = (size_t)uVar2;
    }
    return sVar1;
  case ZSTD_p_windowLog:
    if (value != 0 && value - 0x20 < 0xffffffea) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).windowLog = value;
    break;
  case ZSTD_p_hashLog:
    if (value != 0 && value - 0x1f < 0xffffffe7) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).hashLog = value;
    break;
  case ZSTD_p_chainLog:
    if (value != 0 && value - 0x1f < 0xffffffe7) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).chainLog = value;
    break;
  case ZSTD_p_searchLog:
    if (0x1e < value) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).searchLog = value;
    break;
  case ZSTD_p_minMatch:
    if (7 < value) {
      return 0xffffffffffffffd6;
    }
    if ((0xf9U >> (value & 0x1f) & 1) == 0) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).searchLength = value;
    break;
  case ZSTD_p_targetLength:
    (CCtxParams->cParams).targetLength = value;
    break;
  case ZSTD_p_compressionStrategy:
    if (8 < value) {
      return 0xffffffffffffffd6;
    }
    (CCtxParams->cParams).strategy = value;
    break;
  default:
    switch(param) {
    case ZSTD_p_enableLongDistanceMatching:
      (CCtxParams->ldmParams).enableLdm = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_p_ldmHashLog:
      if (value != 0 && value - 0x1f < 0xffffffe7) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).hashLog = value;
      break;
    case ZSTD_p_ldmMinMatch:
      if (value != 0 && value - 0x1001 < 0xfffff003) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).minMatchLength = value;
      break;
    case ZSTD_p_ldmBucketSizeLog:
      if (8 < value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).bucketSizeLog = value;
      break;
    case ZSTD_p_ldmHashEveryLog:
      if (0x19 < value) {
        return 0xffffffffffffffd6;
      }
      (CCtxParams->ldmParams).hashEveryLog = value;
      break;
    default:
      if (param == ZSTD_p_forceMaxWindow) {
        CCtxParams->forceWindow = (uint)(value != 0);
        return (ulong)(uint)(value != 0);
      }
      if (param == ZSTD_p_contentSizeFlag) {
        (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
        return (ulong)(value != 0);
      }
      if (param == ZSTD_p_checksumFlag) {
        (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
        return (ulong)(uint)(value != 0);
      }
      if (param == ZSTD_p_dictIDFlag) {
        (CCtxParams->fParams).noDictIDFlag = (uint)(value == 0);
        return (ulong)(value != 0);
      }
      if (param == ZSTD_p_nbWorkers) {
        sVar1 = 0xffffffffffffffd8;
        if (value == 0) {
          sVar1 = 0;
        }
        return sVar1;
      }
      if (param == ZSTD_p_compressLiterals) {
        CCtxParams->disableLiteralCompression = (uint)(value == 0);
        return (ulong)(value != 0);
      }
      if (param != ZSTD_p_format) {
        return 0xffffffffffffffd8;
      }
      if (1 < value) {
        return 0xffffffffffffffd8;
      }
      CCtxParams->format = value;
    }
  }
  return (ulong)value;
}

Assistant:

size_t ZSTD_CCtxParam_setParameter(
        ZSTD_CCtx_params* CCtxParams, ZSTD_cParameter param, unsigned value)
{
    DEBUGLOG(4, "ZSTD_CCtxParam_setParameter (%u, %u)", (U32)param, value);
    switch(param)
    {
    case ZSTD_p_format :
        if (value > (unsigned)ZSTD_f_zstd1_magicless)
            return ERROR(parameter_unsupported);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_p_compressionLevel : {
        int cLevel = (int)value;  /* cast expected to restore negative sign */
        if (cLevel > ZSTD_maxCLevel()) cLevel = ZSTD_maxCLevel();
        if (cLevel) {  /* 0 : does not change current level */
            CCtxParams->disableLiteralCompression = (cLevel<0);  /* negative levels disable huffman */
            CCtxParams->compressionLevel = cLevel;
        }
        if (CCtxParams->compressionLevel >= 0) return CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_p_windowLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_WINDOWLOG_MIN, ZSTD_WINDOWLOG_MAX);
        CCtxParams->cParams.windowLog = value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_p_hashLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
        CCtxParams->cParams.hashLog = value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_p_chainLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_CHAINLOG_MIN, ZSTD_CHAINLOG_MAX);
        CCtxParams->cParams.chainLog = value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_p_searchLog :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_SEARCHLOG_MIN, ZSTD_SEARCHLOG_MAX);
        CCtxParams->cParams.searchLog = value;
        return value;

    case ZSTD_p_minMatch :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, ZSTD_SEARCHLENGTH_MIN, ZSTD_SEARCHLENGTH_MAX);
        CCtxParams->cParams.searchLength = value;
        return CCtxParams->cParams.searchLength;

    case ZSTD_p_targetLength :
        /* all values are valid. 0 => use default */
        CCtxParams->cParams.targetLength = value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_p_compressionStrategy :
        if (value>0)   /* 0 => use default */
            CLAMPCHECK(value, (unsigned)ZSTD_fast, (unsigned)ZSTD_btultra);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_p_compressLiterals:
        CCtxParams->disableLiteralCompression = !value;
        return !CCtxParams->disableLiteralCompression;

    case ZSTD_p_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value>0));
        CCtxParams->fParams.contentSizeFlag = value > 0;
        return CCtxParams->fParams.contentSizeFlag;

    case ZSTD_p_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value > 0;
        return CCtxParams->fParams.checksumFlag;

    case ZSTD_p_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value>0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_p_forceMaxWindow :
        CCtxParams->forceWindow = (value > 0);
        return CCtxParams->forceWindow;

    case ZSTD_p_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        if (value>0) return ERROR(parameter_unsupported);
        return 0;
#else
        return ZSTDMT_CCtxParam_setNbWorkers(CCtxParams, value);
#endif

    case ZSTD_p_jobSize :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_jobSize, value);
#endif

    case ZSTD_p_overlapSizeLog :
#ifndef ZSTD_MULTITHREAD
        return ERROR(parameter_unsupported);
#else
        return ZSTDMT_CCtxParam_setMTCtxParameter(CCtxParams, ZSTDMT_p_overlapSectionLog, value);
#endif

    case ZSTD_p_enableLongDistanceMatching :
        CCtxParams->ldmParams.enableLdm = (value>0);
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_p_ldmHashLog :
        if (value>0)   /* 0 ==> auto */
            CLAMPCHECK(value, ZSTD_HASHLOG_MIN, ZSTD_HASHLOG_MAX);
        CCtxParams->ldmParams.hashLog = value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_p_ldmMinMatch :
        if (value>0)   /* 0 ==> default */
            CLAMPCHECK(value, ZSTD_LDM_MINMATCH_MIN, ZSTD_LDM_MINMATCH_MAX);
        CCtxParams->ldmParams.minMatchLength = value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_p_ldmBucketSizeLog :
        if (value > ZSTD_LDM_BUCKETSIZELOG_MAX)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.bucketSizeLog = value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_p_ldmHashEveryLog :
        if (value > ZSTD_WINDOWLOG_MAX - ZSTD_HASHLOG_MIN)
            return ERROR(parameter_outOfBound);
        CCtxParams->ldmParams.hashEveryLog = value;
        return CCtxParams->ldmParams.hashEveryLog;

    default: return ERROR(parameter_unsupported);
    }
}